

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O1

pair<kitty::static_truth_table<5U,_true>,_bool> __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<5u,true>>::
run<void(&)(std::vector<kitty::detail::spectral_operation,std::allocator<kitty::detail::spectral_operation>>const&)>
          (miller_spectral_canonization_impl<kitty::static_truth_table<5u,true>> *this,
          _func_void_vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>_ptr
          *fn)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint *puVar4;
  undefined7 extraout_var;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_type __n;
  pair<kitty::static_truth_table<5U,_true>,_bool> pVar9;
  static_truth_table<5U,_true> tt;
  allocator_type local_3d;
  value_type_conflict3 local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  iVar1 = *(int *)(this + 8);
  __n = 1L << ((byte)iVar1 & 0x3f);
  local_3c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_38,__n,&local_3c,&local_3d);
  if (iVar1 != 0) {
    puVar4 = local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
    uVar8 = (uint)__n;
    if (uVar8 < 3) {
      uVar8 = 2;
    }
    uVar2 = iVar1 + 1U;
    if (iVar1 + 1U < 3) {
      uVar2 = 2;
    }
    uVar5 = 1;
    do {
      uVar6 = 1;
      do {
        uVar7 = uVar6 - (uVar6 >> 1 & 0x55555555);
        uVar7 = (uVar7 >> 2 & 0x33333333) + (uVar7 & 0x33333333);
        if (((uVar7 >> 4) + uVar7 & 0xf0f0f0f) * 0x1010101 >> 0x18 == uVar5) {
          *puVar4 = uVar6;
          puVar4 = puVar4 + 1;
        }
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar2);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x78),&local_38);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  bVar3 = miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_>::normalize
                    ((miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_> *)this
                    );
  (*fn)((vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
         *)(this + 0xa8));
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  spectrum::to_truth_table<kitty::static_truth_table<5u,true>>
            ((spectrum *)(this + 0x10),(static_truth_table<5U,_true> *)&local_38);
  pVar9._8_8_ = CONCAT71(extraout_var,bVar3) & 0xffffffff;
  pVar9.first._bits =
       (uint64_t)
       local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  return pVar9;
}

Assistant:

std::pair<TT, bool> run( Callback&& fn )
  {
    order = get_rw_coeffecient_order( num_vars );
    const auto exact = normalize();

    fn( best_transforms );

    TT tt = func.construct();
    spec.to_truth_table<TT>( tt );
    return { tt, exact };
  }